

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakeLanguageCommand.cxx
# Opt level: O1

bool anon_unknown.dwarf_7a3ef3::cmCMakeLanguageCommandDEFER
               (Defer *defer,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *args,size_t arg,cmExecutionStatus *status)

{
  pointer pbVar1;
  pointer __s1;
  size_type sVar2;
  cmMakefile *pcVar3;
  bool bVar4;
  int iVar5;
  long lVar6;
  string *psVar7;
  string *id;
  byte bVar8;
  size_type __rlen;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_01;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_02;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_03;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_04;
  string_view value;
  string_view value_00;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> ids;
  basic_string_view<char,_std::char_traits<char>_> local_b0;
  size_type local_a0;
  pointer local_98;
  undefined8 local_90;
  char *local_88;
  undefined1 local_80 [32];
  bool local_60;
  cmMakefile *local_58;
  string local_50;
  
  local_58 = defer->Directory;
  if (local_58 == (cmMakefile *)0x0) {
    local_58 = status->Makefile;
  }
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  __s1 = pbVar1[arg]._M_dataplus._M_p;
  sVar2 = pbVar1[arg]._M_string_length;
  if (sVar2 == 8) {
    iVar5 = bcmp(__s1,"GET_CALL",8);
    pcVar3 = local_58;
    if (iVar5 != 0) goto LAB_00249ba2;
    lVar6 = (long)(args->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5;
    if (arg + 1 != lVar6) {
      if (arg + 2 == lVar6) {
        local_b0._M_len = (size_t)&local_a0;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_b0,"DEFER GET_CALL missing output variable","");
        std::__cxx11::string::_M_assign((string *)&status->Error);
        goto LAB_0024a00e;
      }
      if (arg + 3 != lVar6) {
        local_b0._M_len = (size_t)&local_a0;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_b0,"DEFER GET_CALL given too many arguments","");
        std::__cxx11::string::_M_assign((string *)&status->Error);
        goto LAB_0024a00e;
      }
      psVar7 = pbVar1 + arg + 1;
      if (psVar7->_M_string_length == 0) {
        local_b0._M_len = (size_t)&local_a0;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_b0,"DEFER GET_CALL id may not be empty","");
        std::__cxx11::string::_M_assign((string *)&status->Error);
        goto LAB_0024a00e;
      }
      if (0x19 < (byte)(*(psVar7->_M_dataplus)._M_p + 0xbfU)) {
        cmMakefile::DeferGetCall
                  ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_80,local_58,psVar7);
        bVar8 = local_60;
        if (local_60 == false) {
          psVar7 = cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_(pcVar3);
          local_98 = (psVar7->_M_dataplus)._M_p;
          local_a0 = psVar7->_M_string_length;
          local_b0._M_len = 0x2b;
          local_b0._M_str = "DEFER GET_CALL may not access directory:\n  ";
          local_90 = 0xe;
          local_88 = "\nat this time.";
          views_04._M_len = 3;
          views_04._M_array = &local_b0;
          cmCatViews_abi_cxx11_(&local_50,views_04);
          std::__cxx11::string::_M_assign((string *)&status->Error);
          goto LAB_00249fae;
        }
        value_00._M_str = (char *)local_80._0_8_;
        value_00._M_len = local_80._8_8_;
        cmMakefile::AddDefinition(status->Makefile,pbVar1 + arg + 2,value_00);
        goto LAB_0024a087;
      }
      local_98 = (psVar7->_M_dataplus)._M_p;
      local_a0 = psVar7->_M_string_length;
      local_b0._M_len = 0x22;
      local_b0._M_str = "DEFER GET_CALL unknown argument:\n ";
      views_00._M_len = 2;
      views_00._M_array = &local_b0;
      cmCatViews_abi_cxx11_((string *)local_80,views_00);
      std::__cxx11::string::_M_assign((string *)&status->Error);
      goto LAB_00249bed;
    }
    local_b0._M_len = (size_t)&local_a0;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_b0,"DEFER GET_CALL missing id","");
    std::__cxx11::string::_M_assign((string *)&status->Error);
LAB_0024a00e:
    cmSystemTools::s_FatalErrorOccurred = true;
    local_80._16_8_ = local_a0;
    local_80._0_8_ = local_b0._M_len;
    if ((size_type *)local_b0._M_len != &local_a0) goto LAB_0024a027;
  }
  else {
    if (sVar2 == 0xc) {
      iVar5 = bcmp(__s1,"GET_CALL_IDS",0xc);
      pcVar3 = local_58;
      if (iVar5 == 0) {
        lVar6 = (long)(args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5;
        if (arg + 1 == lVar6) {
          local_b0._M_len = (size_t)&local_a0;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_b0,"DEFER GET_CALL_IDS missing output variable","");
          std::__cxx11::string::_M_assign((string *)&status->Error);
        }
        else {
          if (arg + 2 == lVar6) {
            cmMakefile::DeferGetCallIds_abi_cxx11_
                      ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)local_80,local_58);
            bVar8 = local_60;
            if (local_60 == false) {
              psVar7 = cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_(pcVar3);
              local_98 = (psVar7->_M_dataplus)._M_p;
              local_a0 = psVar7->_M_string_length;
              local_b0._M_len = 0x2f;
              local_b0._M_str = "DEFER GET_CALL_IDS may not access directory:\n  ";
              local_90 = 0xe;
              local_88 = "\nat this time.";
              views_03._M_len = 3;
              views_03._M_array = &local_b0;
              cmCatViews_abi_cxx11_(&local_50,views_03);
              std::__cxx11::string::_M_assign((string *)&status->Error);
LAB_00249fae:
              cmSystemTools::s_FatalErrorOccurred = true;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_50._M_dataplus._M_p != &local_50.field_2) {
                operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1
                               );
              }
            }
            else {
              value._M_str = (char *)local_80._0_8_;
              value._M_len = local_80._8_8_;
              cmMakefile::AddDefinition(status->Makefile,pbVar1 + arg + 1,value);
            }
LAB_0024a087:
            if (local_60 == true) {
              local_60 = false;
LAB_0024a097:
              if ((undefined1 *)local_80._0_8_ != local_80 + 0x10) {
                operator_delete((void *)local_80._0_8_,local_80._16_8_ + 1);
              }
            }
            goto LAB_0024a031;
          }
          local_b0._M_len = (size_t)&local_a0;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_b0,"DEFER GET_CALL_IDS given too many arguments","");
          std::__cxx11::string::_M_assign((string *)&status->Error);
        }
        goto LAB_0024a00e;
      }
    }
    else if ((sVar2 == 0xb) && (iVar5 = bcmp(__s1,"CANCEL_CALL",0xb), pcVar3 = local_58, iVar5 == 0)
            ) {
      psVar7 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      for (id = pbVar1 + arg + 1; bVar8 = id == psVar7, !(bool)bVar8; id = id + 1) {
        if ((byte)(*(id->_M_dataplus)._M_p + 0xbfU) < 0x1a) {
          local_98 = (id->_M_dataplus)._M_p;
          local_a0 = id->_M_string_length;
          local_b0._M_len = 0x26;
          local_b0._M_str = "DEFER CANCEL_CALL unknown argument:\n  ";
          views_01._M_len = 2;
          views_01._M_array = &local_b0;
          cmCatViews_abi_cxx11_((string *)local_80,views_01);
          std::__cxx11::string::_M_assign((string *)&status->Error);
LAB_00249f01:
          cmSystemTools::s_FatalErrorOccurred = true;
          goto LAB_0024a097;
        }
        bVar4 = cmMakefile::DeferCancelCall(pcVar3,id);
        if (!bVar4) {
          psVar7 = cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_(pcVar3);
          local_98 = (psVar7->_M_dataplus)._M_p;
          local_a0 = psVar7->_M_string_length;
          local_b0._M_len = 0x2e;
          local_b0._M_str = "DEFER CANCEL_CALL may not update directory:\n  ";
          local_90 = 0xe;
          local_88 = "\nat this time.";
          views_02._M_len = 3;
          views_02._M_array = &local_b0;
          cmCatViews_abi_cxx11_((string *)local_80,views_02);
          std::__cxx11::string::_M_assign((string *)&status->Error);
          goto LAB_00249f01;
        }
      }
      goto LAB_0024a031;
    }
LAB_00249ba2:
    local_98 = pbVar1[arg]._M_dataplus._M_p;
    local_a0 = pbVar1[arg]._M_string_length;
    local_b0._M_len = 0x19;
    local_b0._M_str = "DEFER operation unknown: ";
    views._M_len = 2;
    views._M_array = &local_b0;
    cmCatViews_abi_cxx11_((string *)local_80,views);
    std::__cxx11::string::_M_assign((string *)&status->Error);
LAB_00249bed:
    cmSystemTools::s_FatalErrorOccurred = true;
    if ((undefined1 *)local_80._0_8_ != local_80 + 0x10) {
LAB_0024a027:
      cmSystemTools::s_FatalErrorOccurred = true;
      operator_delete((void *)local_80._0_8_,local_80._16_8_ + 1);
    }
  }
  bVar8 = 0;
LAB_0024a031:
  return (bool)(bVar8 & 1);
}

Assistant:

bool cmCMakeLanguageCommandDEFER(Defer const& defer,
                                 std::vector<std::string> const& args,
                                 size_t arg, cmExecutionStatus& status)
{
  cmMakefile* deferMakefile =
    defer.Directory ? defer.Directory : &status.GetMakefile();
  if (args[arg] == "CANCEL_CALL"_s) {
    ++arg; // Consume CANCEL_CALL.
    auto ids = cmMakeRange(args).advance(arg);
    for (std::string const& id : ids) {
      if (id[0] >= 'A' && id[0] <= 'Z') {
        return FatalError(
          status, cmStrCat("DEFER CANCEL_CALL unknown argument:\n  "_s, id));
      }
      if (!deferMakefile->DeferCancelCall(id)) {
        return FatalError(
          status,
          cmStrCat("DEFER CANCEL_CALL may not update directory:\n  "_s,
                   deferMakefile->GetCurrentBinaryDirectory(),
                   "\nat this time."_s));
      }
    }
    return true;
  }
  if (args[arg] == "GET_CALL_IDS"_s) {
    ++arg; // Consume GET_CALL_IDS.
    if (arg == args.size()) {
      return FatalError(status, "DEFER GET_CALL_IDS missing output variable");
    }
    std::string const& var = args[arg++];
    if (arg != args.size()) {
      return FatalError(status, "DEFER GET_CALL_IDS given too many arguments");
    }
    cm::optional<std::string> ids = deferMakefile->DeferGetCallIds();
    if (!ids) {
      return FatalError(
        status,
        cmStrCat("DEFER GET_CALL_IDS may not access directory:\n  "_s,
                 deferMakefile->GetCurrentBinaryDirectory(),
                 "\nat this time."_s));
    }
    status.GetMakefile().AddDefinition(var, *ids);
    return true;
  }
  if (args[arg] == "GET_CALL"_s) {
    ++arg; // Consume GET_CALL.
    if (arg == args.size()) {
      return FatalError(status, "DEFER GET_CALL missing id");
    }
    std::string const& id = args[arg++];
    if (arg == args.size()) {
      return FatalError(status, "DEFER GET_CALL missing output variable");
    }
    std::string const& var = args[arg++];
    if (arg != args.size()) {
      return FatalError(status, "DEFER GET_CALL given too many arguments");
    }
    if (id.empty()) {
      return FatalError(status, "DEFER GET_CALL id may not be empty");
    }
    if (id[0] >= 'A' && id[0] <= 'Z') {
      return FatalError(status,
                        cmStrCat("DEFER GET_CALL unknown argument:\n "_s, id));
    }
    cm::optional<std::string> call = deferMakefile->DeferGetCall(id);
    if (!call) {
      return FatalError(
        status,
        cmStrCat("DEFER GET_CALL may not access directory:\n  "_s,
                 deferMakefile->GetCurrentBinaryDirectory(),
                 "\nat this time."_s));
    }
    status.GetMakefile().AddDefinition(var, *call);
    return true;
  }
  return FatalError(status,
                    cmStrCat("DEFER operation unknown: "_s, args[arg]));
}